

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

int Saig_XsimInv(int Value)

{
  int local_c;
  int Value_local;
  
  if (Value == 1) {
    local_c = 2;
  }
  else if (Value == 2) {
    local_c = 1;
  }
  else {
    if (Value != 3) {
      __assert_fail("Value == SAIG_XVSX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x32,"int Saig_XsimInv(int)");
    }
    local_c = 3;
  }
  return local_c;
}

Assistant:

static inline int  Saig_XsimInv( int Value )   
{ 
    if ( Value == SAIG_XVS0 )
        return SAIG_XVS1;
    if ( Value == SAIG_XVS1 )
        return SAIG_XVS0;
    assert( Value == SAIG_XVSX );       
    return SAIG_XVSX;
}